

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O3

void __thiscall
Enhedron::Impl::Impl_Assertion::CerrFailureHandler::fail
          (CerrFailureHandler *this,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *description,string *expressionText,
          vector<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
          *variableList)

{
  pointer pVVar1;
  ostream *poVar2;
  Variable *variable;
  pointer pVVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Assert failed: ",0xf);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(expressionText->_M_dataplus)._M_p,
                      expressionText->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  pVVar1 = (variableList->
           super__Vector_base<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pVVar3 = (variableList->
                super__Vector_base<Enhedron::Assertion::Impl::Configurable::Variable,_std::allocator<Enhedron::Assertion::Impl::Configurable::Variable>_>
                )._M_impl.super__Vector_impl_data._M_start; pVVar3 != pVVar1; pVVar3 = pVVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"    ",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(pVVar3->name_)._M_dataplus._M_p,
                        (pVVar3->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ",3);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pVVar3->value_)._M_dataplus._M_p,(pVVar3->value_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,": in file ",10);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,(pVVar3->file_)._M_dataplus._M_p,(pVVar3->file_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", line ",7);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,pVVar3->line_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  }
  std::ostream::flush();
  std::terminate();
}

Assistant:

virtual void fail(optional<string> description, const string &expressionText, const vector <Variable> &variableList) override {
            cerr << "Assert failed: " << expressionText << "\n";

            for (const auto &variable : variableList) {
                cerr << "    " << variable.name() << " = " << variable.value() <<
                ": in file " << variable.file() << ", line " << variable.line() << "\n";
            }

            cerr.flush();

            #ifndef NDEBUG
                terminate();
            #endif
        }